

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_files.cpp
# Opt level: O2

int create_files(int argc,char **argv)

{
  long *plVar1;
  pointer pbVar2;
  pointer pbVar3;
  ulong *puVar4;
  bool bVar5;
  ulong uVar6;
  void *pvVar7;
  syscall_file *this;
  size_t *psVar8;
  ostream *poVar9;
  int iVar10;
  pointer pcVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  void *pvVar15;
  ulong uVar16;
  ulong uVar17;
  double dVar18;
  size_t buffer_size;
  CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *local_460;
  void *local_458;
  ulong local_450;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  disks_arr;
  void *local_428;
  CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *local_420;
  external_size_type length;
  ulong *local_410;
  CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *local_408;
  external_size_type local_400;
  double local_3f8;
  ulong local_3f0;
  CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> local_3e8 [4];
  undefined1 local_3c8 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_3b0 [44];
  stringstream ss;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_240;
  undefined8 auStack_230 [45];
  CmdlineParser cp;
  
  disks_arr.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  disks_arr.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  disks_arr.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tlx::CmdlineParser::CmdlineParser(&cp);
  std::__cxx11::string::string((string *)&ss,"filesize",(allocator *)local_3e8);
  std::__cxx11::string::string
            ((string *)local_3c8,"Number of bytes to write to files.",(allocator *)&buffer_size);
  tlx::CmdlineParser::add_param_bytes(&cp,(string *)&ss,&length,(string *)local_3c8);
  std::__cxx11::string::~string((string *)local_3c8);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::string((string *)&ss,"filename",(allocator *)local_3e8);
  std::__cxx11::string::string
            ((string *)local_3c8,"Paths to files to write.",(allocator *)&buffer_size);
  tlx::CmdlineParser::add_param_stringlist(&cp,(string *)&ss,&disks_arr,(string *)local_3c8);
  std::__cxx11::string::~string((string *)local_3c8);
  std::__cxx11::string::~string((string *)&ss);
  bVar5 = tlx::CmdlineParser::process(&cp,argc,argv);
  if (bVar5) {
    local_400 = length;
    lVar12 = 0;
    uVar16 = 0;
    while( true ) {
      pbVar3 = disks_arr.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar2 = disks_arr.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar14 = (long)disks_arr.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)disks_arr.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      uVar6 = lVar14 >> 5;
      if (uVar6 <= uVar16) break;
      unlink(*(char **)((long)&((disks_arr.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar12));
      tlx::Logger::Logger((Logger *)&ss);
      std::operator<<((ostream *)&ss,"# Add disk: ");
      std::operator<<((ostream *)&ss,
                      (string *)
                      ((long)&((disks_arr.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                      lVar12));
      tlx::Logger::~Logger((Logger *)&ss);
      uVar16 = uVar16 + 1;
      lVar12 = lVar12 + 0x20;
    }
    buffer_size = 0x10000000;
    local_458 = foxxll::aligned_alloc<4096ul>(lVar14 * 0x800000,0);
    pvVar7 = operator_new__(-(ulong)(uVar6 >> 0x3d != 0) | lVar14 >> 2);
    uVar13 = lVar14 >> 4;
    uVar16 = 0xffffffffffffffff;
    if (uVar13 < 0x2000000000000000) {
      uVar16 = lVar14 >> 1 | 8;
    }
    local_410 = (ulong *)operator_new__(uVar16);
    *local_410 = uVar13;
    local_460 = (CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)(local_410 + 1);
    if (pbVar3 != pbVar2) {
      memset(local_460,0,lVar14 >> 1 & 0xfffffffffffffff8);
    }
    for (lVar12 = 0; lVar14 * 0x200000 != lVar12; lVar12 = lVar12 + 1) {
      *(int *)((long)local_458 + lVar12 * 4) = (int)lVar12;
    }
    lVar12 = 0;
    for (uVar16 = 0; uVar6 != uVar16; uVar16 = uVar16 + 1) {
      this = (syscall_file *)operator_new(0x98);
      foxxll::syscall_file::syscall_file
                (this,(string *)
                      ((long)&((disks_arr.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                      lVar12),0x1c,(int)uVar16,-1,0xffffffff,(file_stats *)0x0);
      *(undefined1 **)((long)pvVar7 + uVar16 * 8) = &(this->super_ufs_file_base).field_0x70;
      lVar12 = lVar12 + 0x20;
    }
    local_408 = local_460 + uVar13;
    uVar16 = 0;
    while( true ) {
      puVar4 = local_410;
      pcVar11 = (pointer)(local_400 - uVar16);
      if (local_400 < uVar16 || pcVar11 == (pointer)0x0) break;
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      psVar8 = &buffer_size;
      if (length != 0) {
        local_3c8._0_8_ = pcVar11;
        if (pcVar11 < (pointer)0x10000000) {
          psVar8 = (size_t *)local_3c8;
        }
      }
      local_450 = *psVar8;
      poVar9 = std::operator<<((ostream *)local_240._M_local_buf,"Disk offset ");
      *(undefined8 *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x10) = 7;
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      poVar9 = std::operator<<(poVar9," MiB: ");
      uVar17 = local_450 >> 1;
      *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) =
           *(uint *)(poVar9 + *(long *)(*(long *)poVar9 + -0x18) + 0x18) & 0xfffffefb | 4;
      local_3f8 = foxxll::timestamp();
      local_428 = local_458;
      local_420 = local_460;
      local_3f0 = uVar16;
      for (uVar13 = 0; uVar16 = local_3f0, uVar13 != uVar6; uVar13 = uVar13 + 1) {
        pvVar15 = local_428;
        for (lVar12 = 0; lVar12 != 0x10; lVar12 = lVar12 + 8) {
          plVar1 = *(long **)((long)pvVar7 + uVar13 * 8);
          local_3c8._16_8_ = 0;
          a_Stack_3b0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_3c8._0_8_ = (pointer)0x0;
          local_3c8._8_8_ = 0;
          (**(code **)(*plVar1 + 8))(local_3e8,plVar1,pvVar15,uVar16,uVar17,local_3c8);
          tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::operator=
                    ((CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)
                     ((long)&local_420->ptr_ + lVar12),local_3e8);
          tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::dec_reference
                    (local_3e8);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_3b0);
          pvVar15 = (void *)((long)pvVar15 + 0x8000000);
          uVar16 = uVar16 + uVar17;
        }
        local_420 = local_420 + 2;
        local_428 = (void *)((long)local_428 + 0x10000000);
      }
      foxxll::wait_all<tlx::CountingPtr<foxxll::request,tlx::CountingPtrDefaultDeleter>*>
                (local_460,local_408);
      dVar18 = foxxll::timestamp();
      *(undefined8 *)((long)auStack_230 + *(long *)(local_240._M_allocated_capacity - 0x18)) = 7;
      poVar9 = (ostream *)
               std::ostream::operator<<
                         (&local_240,
                          (int)(((((double)CONCAT44(0x45300000,(int)(local_450 >> 0x20)) -
                                  1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,(int)local_450) - 4503599627370496.0))
                                * 9.5367431640625e-07) / (dVar18 - local_3f8)));
      std::operator<<(poVar9," MiB/s,");
      tlx::Logger::Logger((Logger *)local_3c8);
      std::__cxx11::stringbuf::str();
      std::operator<<((ostream *)local_3c8,(string *)local_3e8);
      std::__cxx11::string::~string((string *)local_3e8);
      tlx::Logger::~Logger((Logger *)local_3c8);
      uVar16 = uVar16 + local_450;
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    }
    uVar16 = *local_410 * 8;
    uVar13 = uVar16;
    uVar17 = *local_410;
    while (uVar17 != 0) {
      tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::dec_reference
                ((CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)
                 ((long)puVar4 + uVar13));
      uVar13 = uVar13 - 8;
      uVar17 = uVar13;
    }
    operator_delete__(puVar4,uVar16 + 8);
    for (uVar16 = 0; uVar6 != uVar16; uVar16 = uVar16 + 1) {
      plVar1 = *(long **)((long)pvVar7 + uVar16 * 8);
      if (plVar1 != (long *)0x0) {
        (**(code **)(*plVar1 + 0x60))();
      }
    }
    operator_delete__(pvVar7);
    foxxll::aligned_dealloc<4096ul>(local_458);
    iVar10 = 0;
  }
  else {
    iVar10 = -1;
  }
  tlx::CmdlineParser::~CmdlineParser(&cp);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&disks_arr);
  return iVar10;
}

Assistant:

int create_files(int argc, char* argv[])
{
    std::vector<std::string> disks_arr;
    external_size_type offset = 0, length;

    tlx::CmdlineParser cp;
    cp.add_param_bytes(
        "filesize", length,
        "Number of bytes to write to files."
    );
    cp.add_param_stringlist(
        "filename", disks_arr,
        "Paths to files to write."
    );

    if (!cp.process(argc, argv))
        return -1;

    external_size_type endpos = offset + length;

    for (size_t i = 0; i < disks_arr.size(); ++i)
    {
        unlink(disks_arr[i].c_str());
        LOG1 << "# Add disk: " << disks_arr[i];
    }

    const size_t ndisks = disks_arr.size();

#if FOXXLL_WINDOWS
    size_t buffer_size = 64 * MB;
#else
    size_t buffer_size = 256 * MB;
#endif
    const size_t buffer_size_int = buffer_size / sizeof(int);

    unsigned chunks = 2;
    const size_t chunk_size = buffer_size / chunks;
    const size_t chunk_size_int = chunk_size / sizeof(int);

    size_t i = 0, j = 0;

    auto* buffer = static_cast<int*>(foxxll::aligned_alloc<BLOCK_ALIGN>(buffer_size * ndisks));
    file** disks = new file*[ndisks];
    request_ptr* reqs = new request_ptr[ndisks * chunks];
#ifdef WATCH_TIMES
    double* r_finish_times = new double[ndisks];
    double* w_finish_times = new double[ndisks];
#endif

    for (i = 0; i < ndisks * buffer_size_int; i++)
        buffer[i] = static_cast<int>(i);

    for (i = 0; i < ndisks; i++)
    {
#if FOXXLL_WINDOWS
 #ifdef RAW_ACCESS
        disks[i] = new foxxll::wincall_file(
                disks_arr[i],
                file::CREAT | file::RDWR | file::DIRECT, static_cast<int>(i)
            );
 #else
        disks[i] = new foxxll::wincall_file(
                disks_arr[i],
                file::CREAT | file::RDWR, static_cast<int>(i)
            );
 #endif
#else
 #ifdef RAW_ACCESS
        disks[i] = new foxxll::syscall_file(
                disks_arr[i],
                file::CREAT | file::RDWR | file::DIRECT, static_cast<int>(i)
            );
 #else
        disks[i] = new foxxll::syscall_file(
                disks_arr[i],
                file::CREAT | file::RDWR, static_cast<int>(i)
            );
 #endif
#endif
    }

    while (offset < endpos)
    {
        std::stringstream ss;

        const size_t current_block_size =
            length
            ? static_cast<size_t>(std::min<external_size_type>(buffer_size, endpos - offset))
            : buffer_size;

        const size_t current_chunk_size = current_block_size / chunks;

        ss << "Disk offset " << std::setw(7) << offset / MB << " MiB: " << std::fixed;

        double begin = timestamp(), end;

#ifndef DO_ONLY_READ
        for (i = 0; i < ndisks; i++)
        {
            for (j = 0; j < chunks; j++)
                reqs[i * chunks + j] =
                    disks[i]->awrite(
                        buffer + buffer_size_int * i + j * chunk_size_int,
                        offset + j * current_chunk_size,
                        current_chunk_size
                    );
        }

 #ifdef WATCH_TIMES
        watch_times(reqs, ndisks, w_finish_times);
 #else
        wait_all(reqs, ndisks * chunks);
 #endif

        end = timestamp();

 #ifdef WATCH_TIMES
        out_stat(begin, end, w_finish_times, ndisks, disks_arr);
 #endif
        ss << std::setw(7) << int(double(current_block_size) / MB / (end - begin)) << " MiB/s,";
#endif

#ifndef NOREAD
        begin = timestamp();

        for (i = 0; i < ndisks; i++)
        {
            for (j = 0; j < chunks; j++)
                reqs[i * chunks + j] = disks[i]->aread(
                        buffer + buffer_size_int * i + j * chunk_size_int,
                        offset + j * current_chunk_size,
                        current_chunk_size
                    );
        }

 #ifdef WATCH_TIMES
        watch_times(reqs, ndisks, r_finish_times);
 #else
        wait_all(reqs, ndisks * chunks);
 #endif

        end = timestamp();

        ss << int(double(current_block_size) / MB / (end - begin)) << " MiB/s";
        ss.str();

#ifdef WATCH_TIMES
        out_stat(begin, end, r_finish_times, ndisks, disks_arr);
#endif

        if (CHECK_AFTER_READ) {
            for (size_t i = 0; i < ndisks * buffer_size_int; i++)
            {
                if (buffer[i] != static_cast<int>(i))
                {
                    size_t ibuf = i / buffer_size_int;
                    size_t pos = i % buffer_size_int;

                    LOG1 << "Error on disk " << ibuf << " position " << std::hex << std::setw(8) << offset + pos * sizeof(int)
                         << "  got: " << std::hex << std::setw(8) << buffer[i] << " wanted: " << std::hex << std::setw(8) << static_cast<int>(i)
                         << std::dec;

                    i = (ibuf + 1) * buffer_size_int; // jump to next
                }
            }
        }
#else
        LOG1 << ss.str();
#endif

        offset += current_block_size;
    }

#ifdef WATCH_TIMES
    delete[] r_finish_times;
    delete[] w_finish_times;
#endif
    delete[] reqs;
    for (i = 0; i < ndisks; i++)
        delete disks[i];
    delete[] disks;
    foxxll::aligned_dealloc<BLOCK_ALIGN>(buffer);

    return 0;
}